

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O3

void __thiscall mjs::anon_unknown_46::json_lexer::~json_lexer(json_lexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pwVar2;
  
  pwVar2 = (this->tok_).text_._M_dataplus._M_p;
  paVar1 = &(this->tok_).text_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != paVar1) {
    operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  pwVar2 = (this->text_)._M_dataplus._M_p;
  paVar1 = &(this->text_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != paVar1) {
    operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this);
  return;
}

Assistant:

explicit json_lexer(const gc_heap_ptr<global_object>& global, std::wstring&& text)
        : global_{global}
        , text_{std::move(text)}
        , pos_{0}
        , tok_{json_token_type::eof, 0} {
        next_token();
    }